

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void leveldb::AddBoundaryInputs
               (InternalKeyComparator *icmp,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *level_files,
               vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               *compaction_files)

{
  bool bVar1;
  FileMetaData *smallest_boundary_file;
  InternalKey largest_key;
  FileMetaData *local_50;
  InternalKey local_48;
  
  local_48.rep_._M_dataplus._M_p = (pointer)&local_48.rep_.field_2;
  local_48.rep_._M_string_length = 0;
  local_48.rep_.field_2._M_local_buf[0] = '\0';
  bVar1 = FindLargestKey(icmp,compaction_files,&local_48);
  if (bVar1) {
    while( true ) {
      local_50 = FindSmallestBoundaryFile(icmp,level_files,&local_48);
      if (local_50 == (FileMetaData *)0x0) break;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                (compaction_files,&local_50);
      std::__cxx11::string::_M_assign((string *)&local_48);
    }
  }
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void AddBoundaryInputs(const InternalKeyComparator& icmp,
                       const std::vector<FileMetaData*>& level_files,
                       std::vector<FileMetaData*>* compaction_files) {
  InternalKey largest_key;

  // Quick return if compaction_files is empty.
  if (!FindLargestKey(icmp, *compaction_files, &largest_key)) {
    return;
  }

  bool continue_searching = true;
  while (continue_searching) {
    FileMetaData* smallest_boundary_file =
        FindSmallestBoundaryFile(icmp, level_files, largest_key);

    // If a boundary file was found advance largest_key, otherwise we're done.
    if (smallest_boundary_file != NULL) {
      compaction_files->push_back(smallest_boundary_file);
      largest_key = smallest_boundary_file->largest;
    } else {
      continue_searching = false;
    }
  }
}